

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O1

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  N_Vector p_Var1;
  N_Vector *pp_Var2;
  void *pvVar3;
  int *piVar4;
  long lVar5;
  
  if (S != (SUNLinearSolver)0x0) {
    p_Var1 = *(N_Vector *)((long)S->content + 0x80);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x90);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    pp_Var2 = *(N_Vector **)((long)S->content + 0x60);
    if (pp_Var2 != (N_Vector *)0x0) {
      N_VDestroyVectorArray(pp_Var2,*S->content + 1);
    }
    pp_Var2 = *(N_Vector **)((long)S->content + 0x68);
    if (pp_Var2 != (N_Vector *)0x0) {
      N_VDestroyVectorArray(pp_Var2,*S->content + 1);
    }
    if (*(long *)((long)S->content + 0x70) != 0) {
      piVar4 = (int *)S->content;
      if (-1 < *piVar4) {
        lVar5 = -1;
        do {
          pvVar3 = *(void **)(*(long *)(piVar4 + 0x1c) + 8 + lVar5 * 8);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          piVar4 = (int *)S->content;
          lVar5 = lVar5 + 1;
        } while (lVar5 < *piVar4);
      }
      free(*(void **)(piVar4 + 0x1c));
    }
    pvVar3 = *(void **)((long)S->content + 0x78);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    pvVar3 = *(void **)((long)S->content + 0x88);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    pvVar3 = *(void **)((long)S->content + 0x98);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    pvVar3 = *(void **)((long)S->content + 0xa0);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    free(S->content);
    S->content = (void *)0x0;
    free(S->ops);
    S->ops = (_generic_SUNLinearSolver_Ops *)0x0;
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPFGMR_CONTENT(S)->xcor)
    N_VDestroy(SPFGMR_CONTENT(S)->xcor);
  if (SPFGMR_CONTENT(S)->vtemp)
    N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
  if (SPFGMR_CONTENT(S)->V)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Z)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Hes) {
    for (k=0; k<=SPFGMR_CONTENT(S)->maxl; k++)
      if (SPFGMR_CONTENT(S)->Hes[k])
        free(SPFGMR_CONTENT(S)->Hes[k]);
    free(SPFGMR_CONTENT(S)->Hes);
  }
  if (SPFGMR_CONTENT(S)->givens)
    free(SPFGMR_CONTENT(S)->givens);
  if (SPFGMR_CONTENT(S)->yg)
    free(SPFGMR_CONTENT(S)->yg);
  if (SPFGMR_CONTENT(S)->cv)
    free(SPFGMR_CONTENT(S)->cv);
  if (SPFGMR_CONTENT(S)->Xv)
    free(SPFGMR_CONTENT(S)->Xv);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}